

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCheckIN(Parse *pParse,Expr *pIn)

{
  int nActual;
  Expr *pExpr;
  int nExpect;
  
  pExpr = pIn->pLeft;
  nExpect = sqlite3ExprVectorSize(pExpr);
  if ((pIn->flags & 0x800) == 0) {
    if (nExpect == 1) {
      return 0;
    }
    sqlite3VectorErrorMsg(pParse,pExpr);
  }
  else {
    nActual = ((pIn->x).pSelect)->pEList->nExpr;
    if (nExpect == nActual) {
      return 0;
    }
    sqlite3SubselectError(pParse,nActual,nExpect);
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCheckIN(Parse *pParse, Expr *pIn){
  int nVector = sqlite3ExprVectorSize(pIn->pLeft);
  if( (pIn->flags & EP_xIsSelect) ){
    if( nVector!=pIn->x.pSelect->pEList->nExpr ){
      sqlite3SubselectError(pParse, pIn->x.pSelect->pEList->nExpr, nVector);
      return 1;
    }
  }else if( nVector!=1 ){
    sqlite3VectorErrorMsg(pParse, pIn->pLeft);
    return 1;
  }
  return 0;
}